

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

int __thiscall
google::protobuf::internal::EpsCopyInputStream::PushLimit
          (EpsCopyInputStream *this,char *ptr,int limit)

{
  int iVar1;
  LogMessage *pLVar2;
  uint uVar3;
  LogMessage local_68 [63];
  LogFinisher local_29;
  
  if (0x7fffffef < (uint)limit) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/parse_context.h"
               ,0x80);
    pLVar2 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_68,"CHECK failed: limit >= 0 && limit <= INT_MAX - kSlopBytes: ");
    google::protobuf::internal::LogFinisher::operator=(&local_29,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(local_68);
  }
  uVar3 = ((int)ptr - (int)*(long *)(this + 8)) + limit;
  *(long *)this = (long)(int)((int)uVar3 >> 0x1f & uVar3) + *(long *)(this + 8);
  iVar1 = *(int *)(this + 0x1c);
  *(uint *)(this + 0x1c) = uVar3;
  return iVar1 - uVar3;
}

Assistant:

PROTOBUF_MUST_USE_RESULT int PushLimit(const char* ptr, int limit) {
    GOOGLE_DCHECK(limit >= 0 && limit <= INT_MAX - kSlopBytes);
    // This add is safe due to the invariant above, because
    // ptr - buffer_end_ <= kSlopBytes.
    limit += static_cast<int>(ptr - buffer_end_);
    limit_end_ = buffer_end_ + (std::min)(0, limit);
    auto old_limit = limit_;
    limit_ = limit;
    return old_limit - limit;
  }